

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

void __thiscall siamese::Decoder::Decoder(Decoder *this)

{
  long in_RDI;
  RecoveryMatrixState *in_stack_00000018;
  DecoderPacketWindow *in_stack_fffffffffffffff0;
  
  pktalloc::Allocator::Allocator((Allocator *)in_stack_fffffffffffffff0);
  DecoderStats::DecoderStats((DecoderStats *)(in_RDI + 0x1c8));
  CheckedRegionState::CheckedRegionState((CheckedRegionState *)(in_RDI + 0x220));
  RecoveryPacketList::RecoveryPacketList((RecoveryPacketList *)(in_RDI + 0x250));
  DecoderPacketWindow::DecoderPacketWindow(in_stack_fffffffffffffff0);
  RecoveryMatrixState::RecoveryMatrixState(in_stack_00000018);
  GrowingAlignedDataBuffer::GrowingAlignedDataBuffer((GrowingAlignedDataBuffer *)(in_RDI + 0xd00));
  *(undefined4 *)(in_RDI + 0xd10) = 0;
  *(long *)(in_RDI + 0x250) = in_RDI;
  *(long *)(in_RDI + 600) = in_RDI + 0x220;
  *(long *)(in_RDI + 0x288) = in_RDI;
  *(long *)(in_RDI + 0x290) = in_RDI + 0x1c8;
  *(long *)(in_RDI + 0x298) = in_RDI + 0x220;
  *(long *)(in_RDI + 0x2a0) = in_RDI + 0x250;
  *(long *)(in_RDI + 0x2a8) = in_RDI + 0x8f8;
  *(long *)(in_RDI + 0x8f8) = in_RDI;
  *(long *)(in_RDI + 0x900) = in_RDI + 0x288;
  *(long *)(in_RDI + 0x908) = in_RDI + 0x220;
  *(long *)(in_RDI + 0x220) = in_RDI + 0x8f8;
  return;
}

Assistant:

Decoder::Decoder()
{
    RecoveryPackets.TheAllocator  = &TheAllocator;
    RecoveryPackets.CheckedRegion = &CheckedRegion;
    Window.TheAllocator           = &TheAllocator;
    Window.Stats                  = &Stats;
    Window.CheckedRegion          = &CheckedRegion;
    Window.RecoveryPackets        = &RecoveryPackets;
    Window.RecoveryMatrix         = &RecoveryMatrix;
    RecoveryMatrix.TheAllocator   = &TheAllocator;
    RecoveryMatrix.Window         = &Window;
    RecoveryMatrix.CheckedRegion  = &CheckedRegion;
    CheckedRegion.RecoveryMatrix  = &RecoveryMatrix;
}